

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O0

VP8StatusCode
ParseVP8X(uint8_t **data,size_t *data_size,int *found_vp8x,int *width_ptr,int *height_ptr,
         uint32_t *flags_ptr)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  int *in_RCX;
  undefined4 *in_RDX;
  ulong *in_RSI;
  long *in_RDI;
  int *in_R8;
  uint32_t *in_R9;
  uint32_t chunk_size;
  uint32_t flags;
  int height;
  int width;
  uint32_t vp8x_size;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  *in_RDX = 0;
  if (*in_RSI < 8) {
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  if (*(int *)*in_RDI == 0x58385056) {
    uVar1 = GetLE32((uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (uVar1 != 10) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (*in_RSI < 0x12) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    uVar1 = GetLE32((uint8_t *)CONCAT44(10,in_stack_ffffffffffffffb0));
    iVar2 = GetLE24((uint8_t *)0x119352);
    iVar3 = GetLE24((uint8_t *)0x11936a);
    if (0xffffffff < (ulong)((long)(iVar2 + 1) * (long)(iVar3 + 1))) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if (in_R9 != (uint32_t *)0x0) {
      *in_R9 = uVar1;
    }
    if (in_RCX != (int *)0x0) {
      *in_RCX = iVar2 + 1;
    }
    if (in_R8 != (int *)0x0) {
      *in_R8 = iVar3 + 1;
    }
    *in_RDI = *in_RDI + 0x12;
    *in_RSI = *in_RSI - 0x12;
    *in_RDX = 1;
  }
  return VP8_STATUS_OK;
}

Assistant:

static ParseStatus ParseVP8X(WebPDemuxer* const dmux) {
  MemBuffer* const mem = &dmux->mem_;
  uint32_t vp8x_size;

  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  dmux->is_ext_format_ = 1;
  Skip(mem, TAG_SIZE);  // VP8X
  vp8x_size = ReadLE32(mem);
  if (vp8x_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;
  if (vp8x_size < VP8X_CHUNK_SIZE) return PARSE_ERROR;
  vp8x_size += vp8x_size & 1;
  if (SizeIsInvalid(mem, vp8x_size)) return PARSE_ERROR;
  if (MemDataSize(mem) < vp8x_size) return PARSE_NEED_MORE_DATA;

  dmux->feature_flags_ = ReadByte(mem);
  Skip(mem, 3);  // Reserved.
  dmux->canvas_width_  = 1 + ReadLE24s(mem);
  dmux->canvas_height_ = 1 + ReadLE24s(mem);
  if (dmux->canvas_width_ * (uint64_t)dmux->canvas_height_ >= MAX_IMAGE_AREA) {
    return PARSE_ERROR;  // image final dimension is too large
  }
  Skip(mem, vp8x_size - VP8X_CHUNK_SIZE);  // skip any trailing data.
  dmux->state_ = WEBP_DEMUX_PARSED_HEADER;

  if (SizeIsInvalid(mem, CHUNK_HEADER_SIZE)) return PARSE_ERROR;
  if (MemDataSize(mem) < CHUNK_HEADER_SIZE) return PARSE_NEED_MORE_DATA;

  return ParseVP8XChunks(dmux);
}